

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall olc::Sprite::Sprite(Sprite *this,int32_t w,int32_t h)

{
  anon_union_4_2_12391da5_for_Pixel_0 *paVar1;
  long lVar2;
  int iVar3;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar4;
  ulong uVar5;
  
  this->width = 0;
  this->height = 0;
  this->pColData = (Pixel *)0x0;
  this->modeSample = NORMAL;
  this->width = w;
  this->height = h;
  iVar3 = h * w;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar5 = (long)iVar3 * 4;
  }
  paVar1 = (anon_union_4_2_12391da5_for_Pixel_0 *)operator_new__(uVar5);
  if (iVar3 != 0) {
    paVar4 = paVar1;
    do {
      *paVar4 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar1 + iVar3);
  }
  this->pColData = (Pixel *)paVar1;
  if (0 < this->height * this->width) {
    lVar2 = 0;
    do {
      this->pColData[lVar2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)this->height * (long)this->width);
  }
  return;
}

Assistant:

Sprite::Sprite(int32_t w, int32_t h)
	{
		if (pColData) delete[] pColData;
		width = w;		height = h;
		pColData = new Pixel[width * height];
		for (int32_t i = 0; i < width * height; i++)
			pColData[i] = Pixel();
	}